

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O0

void __thiscall
duckdb::SortedAggregateState::FlushLinkedLists
          (SortedAggregateState *this,SortedAggregateBindData *order_bind)

{
  bool bVar1;
  DataChunk *in_RSI;
  LinkedLists *in_RDI;
  LinkedChunkFunctions *unaff_retaddr;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
  *in_stack_ffffffffffffffd0;
  SortedAggregateBindData *in_stack_ffffffffffffffd8;
  SortedAggregateState *in_stack_ffffffffffffffe0;
  LinkedLists *linked;
  
  linked = in_RDI;
  InitializeChunks(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
            (in_stack_ffffffffffffffd0);
  FlushLinkedList(unaff_retaddr,linked,in_RSI);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
                     0xfc6e9c);
  if (bVar1) {
    unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               &in_RDI[3].super_vector<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>.
                super__Vector_base<duckdb::LinkedList,_std::allocator<duckdb::LinkedList>_>._M_impl.
                super__Vector_impl_data._M_finish);
    FlushLinkedList(unaff_retaddr,linked,in_RSI);
  }
  return;
}

Assistant:

void FlushLinkedLists(const SortedAggregateBindData &order_bind) {
		InitializeChunks(order_bind);
		FlushLinkedList(order_bind.sort_funcs, sort_linked, *sort_chunk);
		if (arg_chunk) {
			FlushLinkedList(order_bind.arg_funcs, arg_linked, *arg_chunk);
		}
	}